

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_pandore
          (CImg<unsigned_char> *this,FILE *file,char *filename)

{
  ushort *puVar1;
  char cVar2;
  uchar uVar3;
  float fVar4;
  uchar *puVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined1 auVar103 [15];
  undefined1 auVar104 [15];
  undefined1 auVar105 [15];
  undefined1 auVar106 [15];
  undefined1 auVar107 [15];
  undefined1 auVar108 [15];
  undefined1 auVar109 [15];
  undefined1 auVar110 [15];
  undefined1 auVar111 [15];
  undefined1 auVar112 [15];
  undefined1 auVar113 [15];
  undefined1 auVar114 [15];
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  undefined1 auVar117 [15];
  undefined1 auVar118 [15];
  undefined1 auVar119 [15];
  undefined1 auVar120 [15];
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  undefined1 auVar123 [15];
  undefined1 auVar124 [15];
  undefined1 auVar125 [15];
  undefined1 auVar126 [15];
  undefined1 auVar127 [15];
  undefined1 auVar128 [15];
  undefined1 auVar129 [15];
  undefined1 auVar130 [15];
  undefined1 auVar131 [15];
  uint uVar132;
  uint uVar133;
  unsigned_short *ptr;
  size_t sVar134;
  size_t sVar135;
  uint *puVar136;
  float *pfVar137;
  float *pfVar138;
  uint *puVar139;
  CImgArgumentException *this_00;
  CImgIOException *pCVar140;
  long lVar141;
  int *piVar142;
  size_t to_read;
  ulong uVar143;
  size_t sVar144;
  ulong uVar145;
  long lVar146;
  pointer_____offset_0x10___ *ppuVar147;
  char cVar148;
  char cVar149;
  char *pcVar150;
  char *pcVar151;
  size_t al_read_1;
  ulong uVar152;
  void *pvVar153;
  size_t al_read;
  long lVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  uint dims [8];
  int ptbuf [4];
  uint imageid;
  FILE *local_58;
  CImg<char> header;
  
  if (file == (FILE *)0x0 && filename == (char *)0x0) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar150 = "non-";
    if (this->_is_shared != false) {
      pcVar150 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Specified filename is (null)."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar150,"unsigned char");
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  local_58 = file;
  if (file == (FILE *)0x0) {
    file = (FILE *)cimg::fopen(filename,"rb");
  }
  CImg<char>::CImg(&header,0x20,1,1,1);
  pcVar150 = header._data;
  if (((FILE *)file == (FILE *)0x0) || (header._data == (char *)0x0)) {
    pCVar140 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar140,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0xc,
               "char","s",file,header._data);
    ppuVar147 = &CImgArgumentException::typeinfo;
LAB_001b10e3:
    __cxa_throw(pCVar140,ppuVar147,CImgException::~CImgException);
  }
  uVar143 = 0xc;
  lVar154 = 0;
  do {
    sVar144 = 0x3f00000;
    if (uVar143 < 0x3f00000) {
      sVar144 = uVar143;
    }
    sVar134 = fread(pcVar150 + lVar154,1,sVar144,(FILE *)file);
    lVar154 = lVar154 + sVar134;
    uVar143 = uVar143 - sVar134;
  } while ((sVar144 == sVar134) && (uVar143 != 0));
  if (uVar143 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,0xc);
  }
  lVar154 = 0;
  do {
    cVar2 = "PANDORE"[lVar154];
    cVar148 = cVar2 + ' ';
    if ((byte)(cVar2 + 0xa5U) < 0xe6) {
      cVar148 = cVar2;
    }
    cVar2 = header._data[lVar154];
    cVar149 = cVar2 + ' ';
    if ((byte)(cVar2 + 0xa5U) < 0xe6) {
      cVar149 = cVar2;
    }
    if (cVar148 != cVar149) {
      if ((int)lVar154 != 7) {
        if (local_58 == (FILE *)0x0) {
          cimg::fclose((FILE *)file);
        }
        pCVar140 = (CImgIOException *)__cxa_allocate_exception(0x10);
        pcVar150 = "non-";
        if (this->_is_shared != false) {
          pcVar150 = "";
        }
        pcVar151 = "(FILE*)";
        if (filename != (char *)0x0) {
          pcVar151 = filename;
        }
        CImgIOException::CImgIOException
                  (pCVar140,
                   "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): PANDORE header not found in file \'%s\'."
                   ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,
                   (ulong)this->_spectrum,this->_data,pcVar150,"unsigned char",pcVar151);
        ppuVar147 = &CImgIOException::typeinfo;
        goto LAB_001b10e3;
      }
      break;
    }
    lVar154 = lVar154 + 1;
  } while ((int)lVar154 != 7);
  dims[4] = 0;
  dims[5] = 0;
  dims[6] = 0;
  dims[7] = 0;
  dims[0] = 0;
  dims[1] = 0;
  dims[2] = 0;
  dims[3] = 0;
  ptbuf[0] = 0;
  ptbuf[1] = 0;
  ptbuf[2] = 0;
  ptbuf[3] = 0;
  sVar144 = 1;
  lVar154 = 0;
  do {
    sVar134 = 0xfc0000;
    if (sVar144 * 4 < 0x3f00000) {
      sVar134 = sVar144;
    }
    sVar135 = fread(&imageid + lVar154,4,sVar134,(FILE *)file);
    lVar154 = lVar154 + sVar135;
    sVar144 = sVar144 - sVar135;
  } while ((sVar134 == sVar135) && (sVar144 != 0));
  if (sVar144 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,1);
  }
  pcVar150 = header._data;
  uVar133 = imageid;
  if (0xff < imageid) {
    imageid = imageid >> 0x18 | (imageid & 0xff0000) >> 8 | (imageid & 0xff00) << 8 |
              imageid << 0x18;
  }
  uVar132 = imageid;
  uVar143 = (ulong)imageid;
  if (header._data == (char *)0x0) {
    pCVar140 = (CImgIOException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              ((CImgArgumentException *)pCVar140,
               "cimg::fread(): Invalid reading request of %u %s%s from file %p to buffer %p.",0x14,
               "char","s",file,0);
    ppuVar147 = &CImgArgumentException::typeinfo;
LAB_001b1050:
    __cxa_throw(pCVar140,ppuVar147,CImgException::~CImgException);
  }
  uVar152 = 0x14;
  lVar154 = 0;
  do {
    sVar144 = 0x3f00000;
    if (uVar152 < 0x3f00000) {
      sVar144 = uVar152;
    }
    sVar134 = fread(pcVar150 + lVar154,1,sVar144,(FILE *)file);
    lVar154 = lVar154 + sVar134;
    uVar152 = uVar152 - sVar134;
  } while ((sVar144 == sVar134) && (uVar152 != 0));
  if (uVar152 != 0) {
    cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,0x14);
  }
  switch(uVar132) {
  case 2:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar133 = puVar136[-1];
        puVar136[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,1);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
LAB_001b0771:
      puVar136 = (uint *)((long)puVar136 + lVar141);
    }
    goto LAB_001b0774;
  case 3:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        uVar3 = *(uchar *)pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = uVar3;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 4:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        fVar4 = *pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = (uchar)(int)fVar4;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 5:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar133 = puVar136[-1];
        puVar136[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 6:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        uVar3 = *(uchar *)pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = uVar3;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 7:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        fVar4 = *pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = (uchar)(int)fVar4;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 8:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar175[1] = 0;
      auVar175[0] = (byte)dims[2];
      auVar175[2] = dims[2]._1_1_;
      auVar175[3] = 0;
      auVar175[4] = dims[2]._2_1_;
      auVar175[5] = 0;
      auVar175[6] = dims[2]._3_1_;
      auVar175[7] = 0;
      auVar175[8] = (char)dims[3];
      auVar175[9] = 0;
      auVar175[10] = dims[3]._1_1_;
      auVar175[0xb] = 0;
      auVar175[0xc] = dims[3]._2_1_;
      auVar175[0xd] = 0;
      auVar175[0xe] = dims[3]._3_1_;
      auVar175[0xf] = 0;
      auVar173 = pshuflw(auVar175,auVar175,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar31[0xd] = 0;
      auVar31._0_13_ = dims._0_13_;
      auVar31[0xe] = dims[1]._3_1_;
      auVar42[0xc] = dims[1]._2_1_;
      auVar42._0_12_ = dims._0_12_;
      auVar42._13_2_ = auVar31._13_2_;
      auVar53[0xb] = 0;
      auVar53._0_11_ = dims._0_11_;
      auVar53._12_3_ = auVar42._12_3_;
      auVar64[10] = dims[1]._1_1_;
      auVar64._0_10_ = dims._0_10_;
      auVar64._11_4_ = auVar53._11_4_;
      auVar75[9] = 0;
      auVar75._0_9_ = dims._0_9_;
      auVar75._10_5_ = auVar64._10_5_;
      auVar86[8] = (char)dims[1];
      auVar86._0_8_ = dims._0_8_;
      auVar86._9_6_ = auVar75._9_6_;
      auVar108._7_8_ = 0;
      auVar108._0_7_ = auVar86._8_7_;
      auVar128._1_8_ = SUB158(auVar108 << 0x40,7);
      auVar128[0] = dims[0]._3_1_;
      auVar128._9_6_ = 0;
      auVar129._1_10_ = SUB1510(auVar128 << 0x30,5);
      auVar129[0] = dims[0]._2_1_;
      auVar129._11_4_ = 0;
      auVar97[2] = dims[0]._1_1_;
      auVar97._0_2_ = (ushort)dims[0];
      auVar97._3_12_ = SUB1512(auVar129 << 0x20,3);
      auVar163._0_2_ = (ushort)dims[0] & 0xff;
      auVar163._2_13_ = auVar97._2_13_;
      auVar163[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar163,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 9:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar171[1] = 0;
      auVar171[0] = (byte)dims[2];
      auVar171[2] = dims[2]._1_1_;
      auVar171[3] = 0;
      auVar171[4] = dims[2]._2_1_;
      auVar171[5] = 0;
      auVar171[6] = dims[2]._3_1_;
      auVar171[7] = 0;
      auVar171[8] = (char)dims[3];
      auVar171[9] = 0;
      auVar171[10] = dims[3]._1_1_;
      auVar171[0xb] = 0;
      auVar171[0xc] = dims[3]._2_1_;
      auVar171[0xd] = 0;
      auVar171[0xe] = dims[3]._3_1_;
      auVar171[0xf] = 0;
      auVar173 = pshuflw(auVar171,auVar171,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar28[0xd] = 0;
      auVar28._0_13_ = dims._0_13_;
      auVar28[0xe] = dims[1]._3_1_;
      auVar39[0xc] = dims[1]._2_1_;
      auVar39._0_12_ = dims._0_12_;
      auVar39._13_2_ = auVar28._13_2_;
      auVar50[0xb] = 0;
      auVar50._0_11_ = dims._0_11_;
      auVar50._12_3_ = auVar39._12_3_;
      auVar61[10] = dims[1]._1_1_;
      auVar61._0_10_ = dims._0_10_;
      auVar61._11_4_ = auVar50._11_4_;
      auVar72[9] = 0;
      auVar72._0_9_ = dims._0_9_;
      auVar72._10_5_ = auVar61._10_5_;
      auVar83[8] = (char)dims[1];
      auVar83._0_8_ = dims._0_8_;
      auVar83._9_6_ = auVar72._9_6_;
      auVar105._7_8_ = 0;
      auVar105._0_7_ = auVar83._8_7_;
      auVar122._1_8_ = SUB158(auVar105 << 0x40,7);
      auVar122[0] = dims[0]._3_1_;
      auVar122._9_6_ = 0;
      auVar123._1_10_ = SUB1510(auVar122 << 0x30,5);
      auVar123[0] = dims[0]._2_1_;
      auVar123._11_4_ = 0;
      auVar94[2] = dims[0]._1_1_;
      auVar94._0_2_ = (ushort)dims[0];
      auVar94._3_12_ = SUB1512(auVar123 << 0x20,3);
      auVar161._0_2_ = (ushort)dims[0] & 0xff;
      auVar161._2_13_ = auVar94._2_13_;
      auVar161[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar161,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        uVar3 = *(uchar *)pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = uVar3;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 10:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar167[1] = 0;
      auVar167[0] = (byte)dims[2];
      auVar167[2] = dims[2]._1_1_;
      auVar167[3] = 0;
      auVar167[4] = dims[2]._2_1_;
      auVar167[5] = 0;
      auVar167[6] = dims[2]._3_1_;
      auVar167[7] = 0;
      auVar167[8] = (char)dims[3];
      auVar167[9] = 0;
      auVar167[10] = dims[3]._1_1_;
      auVar167[0xb] = 0;
      auVar167[0xc] = dims[3]._2_1_;
      auVar167[0xd] = 0;
      auVar167[0xe] = dims[3]._3_1_;
      auVar167[0xf] = 0;
      auVar173 = pshuflw(auVar167,auVar167,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar24[0xd] = 0;
      auVar24._0_13_ = dims._0_13_;
      auVar24[0xe] = dims[1]._3_1_;
      auVar35[0xc] = dims[1]._2_1_;
      auVar35._0_12_ = dims._0_12_;
      auVar35._13_2_ = auVar24._13_2_;
      auVar46[0xb] = 0;
      auVar46._0_11_ = dims._0_11_;
      auVar46._12_3_ = auVar35._12_3_;
      auVar57[10] = dims[1]._1_1_;
      auVar57._0_10_ = dims._0_10_;
      auVar57._11_4_ = auVar46._11_4_;
      auVar68[9] = 0;
      auVar68._0_9_ = dims._0_9_;
      auVar68._10_5_ = auVar57._10_5_;
      auVar79[8] = (char)dims[1];
      auVar79._0_8_ = dims._0_8_;
      auVar79._9_6_ = auVar68._9_6_;
      auVar101._7_8_ = 0;
      auVar101._0_7_ = auVar79._8_7_;
      auVar114._1_8_ = SUB158(auVar101 << 0x40,7);
      auVar114[0] = dims[0]._3_1_;
      auVar114._9_6_ = 0;
      auVar115._1_10_ = SUB1510(auVar114 << 0x30,5);
      auVar115[0] = dims[0]._2_1_;
      auVar115._11_4_ = 0;
      auVar90[2] = dims[0]._1_1_;
      auVar90._0_2_ = (ushort)dims[0];
      auVar90._3_12_ = SUB1512(auVar115 << 0x20,3);
      auVar157._0_2_ = (ushort)dims[0] & 0xff;
      auVar157._2_13_ = auVar90._2_13_;
      auVar157[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar157,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        fVar4 = *pfVar137;
        pfVar137 = pfVar137 + 1;
        puVar5[lVar141] = (uchar)(int)fVar4;
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
    }
    break;
  case 0xb:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,1);
    uVar132 = this->_spectrum * this->_depth * this->_height * this->_width;
    if (dims[2] < 0x100) {
      uVar143 = (ulong)uVar132;
      puVar136 = (uint *)operator_new__(uVar143);
      cimg::fread<unsigned_char>((uchar *)puVar136,uVar143,file);
      lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                (ulong)this->_height * (ulong)this->_width;
      if (lVar154 != 0) {
        puVar5 = this->_data;
        lVar141 = 0;
        do {
          puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
          lVar141 = lVar141 + 1;
        } while (lVar154 - lVar141 != 0);
        goto LAB_001b0771;
      }
    }
    else {
      uVar152 = (ulong)uVar132;
      if (dims[2] < 0x10000) {
        uVar143 = uVar152 * 2;
        puVar136 = (uint *)operator_new__(uVar143);
        cimg::fread<unsigned_short>((unsigned_short *)puVar136,uVar152,file);
        if ((0xff < uVar133) && (uVar152 != 0)) {
          puVar139 = (uint *)(uVar152 * 2 + (long)puVar136);
          do {
            puVar1 = (ushort *)((long)puVar139 + -2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar139 = (uint *)((long)puVar139 + -2);
          } while (puVar136 < puVar139);
        }
        lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width;
        if (lVar154 != 0) {
          puVar5 = this->_data;
          lVar141 = 0;
          do {
            uVar133 = *puVar136;
            puVar136 = (uint *)((long)puVar136 + 2);
            puVar5[lVar141] = (uchar)uVar133;
            lVar141 = lVar141 + 1;
          } while (lVar154 - lVar141 != 0);
        }
      }
      else {
        uVar143 = uVar152 * 4;
        puVar136 = (uint *)operator_new__(uVar143);
        cimg::fread<unsigned_int>(puVar136,uVar152,file);
        if ((0xff < uVar133) && (uVar152 != 0)) {
          puVar139 = puVar136 + uVar152;
          do {
            uVar133 = puVar139[-1];
            puVar139[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                           uVar133 << 0x18;
            puVar139 = puVar139 + -1;
          } while (puVar136 < puVar139);
        }
        lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width;
        if (lVar154 != 0) {
          puVar5 = this->_data;
          lVar141 = 0;
          do {
            uVar133 = *puVar136;
            puVar136 = puVar136 + 1;
            puVar5[lVar141] = (uchar)uVar133;
            lVar141 = lVar141 + 1;
          } while (lVar154 - lVar141 != 0);
        }
      }
    }
    goto LAB_001b0774;
  case 0xc:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar166[1] = 0;
      auVar166[0] = (byte)dims[2];
      auVar166[2] = dims[2]._1_1_;
      auVar166[3] = 0;
      auVar166[4] = dims[2]._2_1_;
      auVar166[5] = 0;
      auVar166[6] = dims[2]._3_1_;
      auVar166[7] = 0;
      auVar166[8] = (char)dims[3];
      auVar166[9] = 0;
      auVar166[10] = dims[3]._1_1_;
      auVar166[0xb] = 0;
      auVar166[0xc] = dims[3]._2_1_;
      auVar166[0xd] = 0;
      auVar166[0xe] = dims[3]._3_1_;
      auVar166[0xf] = 0;
      auVar173 = pshuflw(auVar166,auVar166,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar23[0xd] = 0;
      auVar23._0_13_ = dims._0_13_;
      auVar23[0xe] = dims[1]._3_1_;
      auVar34[0xc] = dims[1]._2_1_;
      auVar34._0_12_ = dims._0_12_;
      auVar34._13_2_ = auVar23._13_2_;
      auVar45[0xb] = 0;
      auVar45._0_11_ = dims._0_11_;
      auVar45._12_3_ = auVar34._12_3_;
      auVar56[10] = dims[1]._1_1_;
      auVar56._0_10_ = dims._0_10_;
      auVar56._11_4_ = auVar45._11_4_;
      auVar67[9] = 0;
      auVar67._0_9_ = dims._0_9_;
      auVar67._10_5_ = auVar56._10_5_;
      auVar78[8] = (char)dims[1];
      auVar78._0_8_ = dims._0_8_;
      auVar78._9_6_ = auVar67._9_6_;
      auVar100._7_8_ = 0;
      auVar100._0_7_ = auVar78._8_7_;
      auVar112._1_8_ = SUB158(auVar100 << 0x40,7);
      auVar112[0] = dims[0]._3_1_;
      auVar112._9_6_ = 0;
      auVar113._1_10_ = SUB1510(auVar112 << 0x30,5);
      auVar113[0] = dims[0]._2_1_;
      auVar113._11_4_ = 0;
      auVar89[2] = dims[0]._1_1_;
      auVar89._0_2_ = (ushort)dims[0];
      auVar89._3_12_ = SUB1512(auVar113 << 0x20,3);
      auVar156._0_2_ = (ushort)dims[0] & 0xff;
      auVar156._2_13_ = auVar89._2_13_;
      auVar156[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar156,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[2],dims[1],1,1);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (0xff < dims[3]) {
      if (dims[3] < 0x10000) {
        uVar152 = uVar143 * 2;
        uVar145 = 0xffffffffffffffff;
        if (-1 < (long)uVar143) {
          uVar145 = uVar152;
        }
        puVar136 = (uint *)operator_new__(uVar145);
        cimg::fread<unsigned_short>((unsigned_short *)puVar136,uVar143,file);
        if ((0xff < uVar133) && (0 < (long)uVar143)) {
          puVar139 = (uint *)(uVar143 * 2 + (long)puVar136);
          do {
            puVar1 = (ushort *)((long)puVar139 + -2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            puVar139 = (uint *)((long)puVar139 + -2);
          } while (puVar136 < puVar139);
        }
        lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width;
        if (lVar154 != 0) {
          puVar5 = this->_data;
          lVar141 = 0;
          do {
            uVar133 = *puVar136;
            puVar136 = (uint *)((long)puVar136 + 2);
            puVar5[lVar141] = (uchar)uVar133;
            lVar141 = lVar141 + 1;
          } while (lVar154 - lVar141 != 0);
        }
      }
      else {
        uVar152 = uVar143 * 4;
        puVar136 = (uint *)operator_new__(-(ulong)(uVar143 >> 0x3e != 0) | uVar152);
        cimg::fread<unsigned_int>(puVar136,uVar143,file);
        if ((0xff < uVar133) && (0 < (long)uVar143)) {
          puVar139 = puVar136 + uVar143;
          do {
            uVar133 = puVar139[-1];
            puVar139[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                           uVar133 << 0x18;
            puVar139 = puVar139 + -1;
          } while (puVar136 < puVar139);
        }
        lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                  (ulong)this->_height * (ulong)this->_width;
        if (lVar154 != 0) {
          puVar5 = this->_data;
          lVar141 = 0;
          lVar146 = 0;
          do {
            puVar5[lVar146] = (uchar)puVar136[lVar146];
            lVar146 = lVar146 + 1;
            lVar141 = lVar141 + -4;
          } while (lVar154 - lVar146 != 0);
          goto LAB_001b0f42;
        }
      }
      goto LAB_001b0f45;
    }
    puVar136 = (uint *)operator_new__(uVar143);
    cimg::fread<unsigned_char>((uchar *)puVar136,uVar143,file);
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 0xd:
    sVar144 = 5;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,5);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 5;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[3],dims[2],dims[1],1);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (dims[4] < 0x100) {
      puVar136 = (uint *)operator_new__(uVar143);
      cimg::fread<unsigned_char>((uchar *)puVar136,uVar143,file);
      lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                (ulong)this->_height * (ulong)this->_width;
      if (lVar154 != 0) {
        puVar5 = this->_data;
        lVar141 = 0;
        do {
          puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
          lVar141 = lVar141 + 1;
        } while (lVar154 - lVar141 != 0);
        goto LAB_001b0771;
      }
      goto LAB_001b0774;
    }
    if (dims[4] < 0x10000) {
      uVar152 = uVar143 * 2;
      uVar145 = 0xffffffffffffffff;
      if (-1 < (long)uVar143) {
        uVar145 = uVar152;
      }
      puVar136 = (uint *)operator_new__(uVar145);
      cimg::fread<unsigned_short>((unsigned_short *)puVar136,uVar143,file);
      if ((0xff < uVar133) && (0 < (long)uVar143)) {
        puVar139 = (uint *)(uVar143 * 2 + (long)puVar136);
        do {
          puVar1 = (ushort *)((long)puVar139 + -2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          puVar139 = (uint *)((long)puVar139 + -2);
        } while (puVar136 < puVar139);
      }
      lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                (ulong)this->_height * (ulong)this->_width;
      if (lVar154 != 0) {
        puVar5 = this->_data;
        lVar141 = 0;
        lVar146 = 0;
        do {
          puVar5[lVar146] = (uchar)*(unsigned_short *)((long)puVar136 + lVar146 * 2);
          lVar146 = lVar146 + 1;
          lVar141 = lVar141 + -2;
        } while (lVar154 - lVar146 != 0);
LAB_001b0f42:
        puVar136 = (uint *)((long)puVar136 - lVar141);
      }
    }
    else {
      uVar152 = uVar143 * 4;
      puVar136 = (uint *)operator_new__(-(ulong)(uVar143 >> 0x3e != 0) | uVar152);
      cimg::fread<unsigned_int>(puVar136,uVar143,file);
      if ((0xff < uVar133) && (0 < (long)uVar143)) {
        puVar139 = puVar136 + uVar143;
        do {
          uVar133 = puVar139[-1];
          puVar139[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                         uVar133 << 0x18;
          puVar139 = puVar139 + -1;
        } while (puVar136 < puVar139);
      }
      lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
                (ulong)this->_height * (ulong)this->_width;
      if (lVar154 != 0) {
        puVar5 = this->_data;
        lVar141 = 0;
        lVar146 = 0;
        do {
          puVar5[lVar146] = (uchar)puVar136[lVar146];
          lVar146 = lVar146 + 1;
          lVar141 = lVar141 + -4;
        } while (lVar154 - lVar146 != 0);
        goto LAB_001b0f42;
      }
    }
LAB_001b0f45:
    pvVar153 = (void *)((long)puVar136 - uVar152);
    goto LAB_001b0b0e;
  default:
    if (local_58 == (FILE *)0x0) {
      cimg::fclose((FILE *)file);
    }
    pCVar140 = (CImgIOException *)__cxa_allocate_exception(0x10);
    pcVar150 = "non-";
    if (this->_is_shared != false) {
      pcVar150 = "";
    }
    pcVar151 = "(FILE*)";
    if (filename != (char *)0x0) {
      pcVar151 = filename;
    }
    CImgIOException::CImgIOException
              (pCVar140,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_pandore(): Unable to load data with ID_type %u in file \'%s\'."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar150,"unsigned char",uVar143,pcVar151);
    ppuVar147 = &CImgIOException::typeinfo;
    goto LAB_001b1050;
  case 0x10:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar165[1] = 0;
      auVar165[0] = (byte)dims[2];
      auVar165[2] = dims[2]._1_1_;
      auVar165[3] = 0;
      auVar165[4] = dims[2]._2_1_;
      auVar165[5] = 0;
      auVar165[6] = dims[2]._3_1_;
      auVar165[7] = 0;
      auVar165[8] = (char)dims[3];
      auVar165[9] = 0;
      auVar165[10] = dims[3]._1_1_;
      auVar165[0xb] = 0;
      auVar165[0xc] = dims[3]._2_1_;
      auVar165[0xd] = 0;
      auVar165[0xe] = dims[3]._3_1_;
      auVar165[0xf] = 0;
      auVar173 = pshuflw(auVar165,auVar165,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar22[0xd] = 0;
      auVar22._0_13_ = dims._0_13_;
      auVar22[0xe] = dims[1]._3_1_;
      auVar33[0xc] = dims[1]._2_1_;
      auVar33._0_12_ = dims._0_12_;
      auVar33._13_2_ = auVar22._13_2_;
      auVar44[0xb] = 0;
      auVar44._0_11_ = dims._0_11_;
      auVar44._12_3_ = auVar33._12_3_;
      auVar55[10] = dims[1]._1_1_;
      auVar55._0_10_ = dims._0_10_;
      auVar55._11_4_ = auVar44._11_4_;
      auVar66[9] = 0;
      auVar66._0_9_ = dims._0_9_;
      auVar66._10_5_ = auVar55._10_5_;
      auVar77[8] = (char)dims[1];
      auVar77._0_8_ = dims._0_8_;
      auVar77._9_6_ = auVar66._9_6_;
      auVar99._7_8_ = 0;
      auVar99._0_7_ = auVar77._8_7_;
      auVar110._1_8_ = SUB158(auVar99 << 0x40,7);
      auVar110[0] = dims[0]._3_1_;
      auVar110._9_6_ = 0;
      auVar111._1_10_ = SUB1510(auVar110 << 0x30,5);
      auVar111[0] = dims[0]._2_1_;
      auVar111._11_4_ = 0;
      auVar88[2] = dims[0]._1_1_;
      auVar88._0_2_ = (ushort)dims[0];
      auVar88._3_12_ = SUB1512(auVar111 << 0x20,3);
      auVar155._0_2_ = (ushort)dims[0] & 0xff;
      auVar155._2_13_ = auVar88._2_13_;
      auVar155[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar155,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 0x11:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar168[1] = 0;
      auVar168[0] = (byte)dims[2];
      auVar168[2] = dims[2]._1_1_;
      auVar168[3] = 0;
      auVar168[4] = dims[2]._2_1_;
      auVar168[5] = 0;
      auVar168[6] = dims[2]._3_1_;
      auVar168[7] = 0;
      auVar168[8] = (char)dims[3];
      auVar168[9] = 0;
      auVar168[10] = dims[3]._1_1_;
      auVar168[0xb] = 0;
      auVar168[0xc] = dims[3]._2_1_;
      auVar168[0xd] = 0;
      auVar168[0xe] = dims[3]._3_1_;
      auVar168[0xf] = 0;
      auVar173 = pshuflw(auVar168,auVar168,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar25[0xd] = 0;
      auVar25._0_13_ = dims._0_13_;
      auVar25[0xe] = dims[1]._3_1_;
      auVar36[0xc] = dims[1]._2_1_;
      auVar36._0_12_ = dims._0_12_;
      auVar36._13_2_ = auVar25._13_2_;
      auVar47[0xb] = 0;
      auVar47._0_11_ = dims._0_11_;
      auVar47._12_3_ = auVar36._12_3_;
      auVar58[10] = dims[1]._1_1_;
      auVar58._0_10_ = dims._0_10_;
      auVar58._11_4_ = auVar47._11_4_;
      auVar69[9] = 0;
      auVar69._0_9_ = dims._0_9_;
      auVar69._10_5_ = auVar58._10_5_;
      auVar80[8] = (char)dims[1];
      auVar80._0_8_ = dims._0_8_;
      auVar80._9_6_ = auVar69._9_6_;
      auVar102._7_8_ = 0;
      auVar102._0_7_ = auVar80._8_7_;
      auVar116._1_8_ = SUB158(auVar102 << 0x40,7);
      auVar116[0] = dims[0]._3_1_;
      auVar116._9_6_ = 0;
      auVar117._1_10_ = SUB1510(auVar116 << 0x30,5);
      auVar117[0] = dims[0]._2_1_;
      auVar117._11_4_ = 0;
      auVar91[2] = dims[0]._1_1_;
      auVar91._0_2_ = (ushort)dims[0];
      auVar91._3_12_ = SUB1512(auVar117 << 0x20,3);
      auVar158._0_2_ = (ushort)dims[0] & 0xff;
      auVar158._2_13_ = auVar91._2_13_;
      auVar158[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar158,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
LAB_001b0b05:
      pfVar137 = (float *)((long)pfVar137 - lVar141);
    }
    break;
  case 0x12:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar169[1] = 0;
      auVar169[0] = (byte)dims[2];
      auVar169[2] = dims[2]._1_1_;
      auVar169[3] = 0;
      auVar169[4] = dims[2]._2_1_;
      auVar169[5] = 0;
      auVar169[6] = dims[2]._3_1_;
      auVar169[7] = 0;
      auVar169[8] = (char)dims[3];
      auVar169[9] = 0;
      auVar169[10] = dims[3]._1_1_;
      auVar169[0xb] = 0;
      auVar169[0xc] = dims[3]._2_1_;
      auVar169[0xd] = 0;
      auVar169[0xe] = dims[3]._3_1_;
      auVar169[0xf] = 0;
      auVar173 = pshuflw(auVar169,auVar169,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar26[0xd] = 0;
      auVar26._0_13_ = dims._0_13_;
      auVar26[0xe] = dims[1]._3_1_;
      auVar37[0xc] = dims[1]._2_1_;
      auVar37._0_12_ = dims._0_12_;
      auVar37._13_2_ = auVar26._13_2_;
      auVar48[0xb] = 0;
      auVar48._0_11_ = dims._0_11_;
      auVar48._12_3_ = auVar37._12_3_;
      auVar59[10] = dims[1]._1_1_;
      auVar59._0_10_ = dims._0_10_;
      auVar59._11_4_ = auVar48._11_4_;
      auVar70[9] = 0;
      auVar70._0_9_ = dims._0_9_;
      auVar70._10_5_ = auVar59._10_5_;
      auVar81[8] = (char)dims[1];
      auVar81._0_8_ = dims._0_8_;
      auVar81._9_6_ = auVar70._9_6_;
      auVar103._7_8_ = 0;
      auVar103._0_7_ = auVar81._8_7_;
      auVar118._1_8_ = SUB158(auVar103 << 0x40,7);
      auVar118[0] = dims[0]._3_1_;
      auVar118._9_6_ = 0;
      auVar119._1_10_ = SUB1510(auVar118 << 0x30,5);
      auVar119[0] = dims[0]._2_1_;
      auVar119._11_4_ = 0;
      auVar92[2] = dims[0]._1_1_;
      auVar92._0_2_ = (ushort)dims[0];
      auVar92._3_12_ = SUB1512(auVar119 << 0x20,3);
      auVar159._0_2_ = (ushort)dims[0] & 0xff;
      auVar159._2_13_ = auVar92._2_13_;
      auVar159[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar159,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[2],dims[1],1,3);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = (uchar)(int)pfVar137[lVar146];
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x13:
    sVar144 = 5;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,5);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 5;
      do {
        uVar133 = puVar136[-1];
        puVar136[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 0x14:
    sVar144 = 5;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,5);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 5;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x15:
    sVar144 = 5;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,5);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 5;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[3],dims[2],dims[1],3);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = (uchar)(int)pfVar137[lVar146];
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x16:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar133 = puVar136[-1];
        puVar136[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 0x17:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x18:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x19:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 2;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[1],1,1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = (uchar)(int)pfVar137[lVar146];
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x1a:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar133 = puVar136[-1];
        puVar136[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
    goto LAB_001b0774;
  case 0x1b:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x1c:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x1d:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      puVar136 = dims + 3;
      do {
        uVar132 = puVar136[-1];
        puVar136[-1] = uVar132 >> 0x18 | (uVar132 & 0xff0000) >> 8 | (uVar132 & 0xff00) << 8 |
                       uVar132 << 0x18;
        puVar136 = puVar136 + -1;
      } while (dims < puVar136);
    }
    assign(this,dims[2],dims[1],1,dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = (uchar)(int)pfVar137[lVar146];
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x1e:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar170[1] = 0;
      auVar170[0] = (byte)dims[2];
      auVar170[2] = dims[2]._1_1_;
      auVar170[3] = 0;
      auVar170[4] = dims[2]._2_1_;
      auVar170[5] = 0;
      auVar170[6] = dims[2]._3_1_;
      auVar170[7] = 0;
      auVar170[8] = (char)dims[3];
      auVar170[9] = 0;
      auVar170[10] = dims[3]._1_1_;
      auVar170[0xb] = 0;
      auVar170[0xc] = dims[3]._2_1_;
      auVar170[0xd] = 0;
      auVar170[0xe] = dims[3]._3_1_;
      auVar170[0xf] = 0;
      auVar173 = pshuflw(auVar170,auVar170,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar27[0xd] = 0;
      auVar27._0_13_ = dims._0_13_;
      auVar27[0xe] = dims[1]._3_1_;
      auVar38[0xc] = dims[1]._2_1_;
      auVar38._0_12_ = dims._0_12_;
      auVar38._13_2_ = auVar27._13_2_;
      auVar49[0xb] = 0;
      auVar49._0_11_ = dims._0_11_;
      auVar49._12_3_ = auVar38._12_3_;
      auVar60[10] = dims[1]._1_1_;
      auVar60._0_10_ = dims._0_10_;
      auVar60._11_4_ = auVar49._11_4_;
      auVar71[9] = 0;
      auVar71._0_9_ = dims._0_9_;
      auVar71._10_5_ = auVar60._10_5_;
      auVar82[8] = (char)dims[1];
      auVar82._0_8_ = dims._0_8_;
      auVar82._9_6_ = auVar71._9_6_;
      auVar104._7_8_ = 0;
      auVar104._0_7_ = auVar82._8_7_;
      auVar120._1_8_ = SUB158(auVar104 << 0x40,7);
      auVar120[0] = dims[0]._3_1_;
      auVar120._9_6_ = 0;
      auVar121._1_10_ = SUB1510(auVar120 << 0x30,5);
      auVar121[0] = dims[0]._2_1_;
      auVar121._11_4_ = 0;
      auVar93[2] = dims[0]._1_1_;
      auVar93._0_2_ = (ushort)dims[0];
      auVar93._3_12_ = SUB1512(auVar121 << 0x20,3);
      auVar160._0_2_ = (ushort)dims[0] & 0xff;
      auVar160._2_13_ = auVar93._2_13_;
      auVar160[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar160,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar143 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    puVar136 = (uint *)operator_new__(uVar143);
    if (uVar143 != 0) {
      lVar154 = 0;
      uVar152 = uVar143;
      do {
        sVar144 = 0x3f00000;
        if (uVar152 < 0x3f00000) {
          sVar144 = uVar152;
        }
        sVar134 = fread((uchar *)((long)puVar136 + lVar154),1,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar152 = uVar152 - sVar134;
      } while ((sVar144 == sVar134) && (uVar152 != 0));
      if (uVar152 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar143);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      do {
        puVar5[lVar141] = *(uchar *)((long)puVar136 + lVar141);
        lVar141 = lVar141 + 1;
      } while (lVar154 - lVar141 != 0);
      goto LAB_001b0771;
    }
LAB_001b0774:
    pvVar153 = (void *)((long)puVar136 - uVar143);
    goto LAB_001b0b0e;
  case 0x1f:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar176[1] = 0;
      auVar176[0] = (byte)dims[2];
      auVar176[2] = dims[2]._1_1_;
      auVar176[3] = 0;
      auVar176[4] = dims[2]._2_1_;
      auVar176[5] = 0;
      auVar176[6] = dims[2]._3_1_;
      auVar176[7] = 0;
      auVar176[8] = (char)dims[3];
      auVar176[9] = 0;
      auVar176[10] = dims[3]._1_1_;
      auVar176[0xb] = 0;
      auVar176[0xc] = dims[3]._2_1_;
      auVar176[0xd] = 0;
      auVar176[0xe] = dims[3]._3_1_;
      auVar176[0xf] = 0;
      auVar173 = pshuflw(auVar176,auVar176,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar32[0xd] = 0;
      auVar32._0_13_ = dims._0_13_;
      auVar32[0xe] = dims[1]._3_1_;
      auVar43[0xc] = dims[1]._2_1_;
      auVar43._0_12_ = dims._0_12_;
      auVar43._13_2_ = auVar32._13_2_;
      auVar54[0xb] = 0;
      auVar54._0_11_ = dims._0_11_;
      auVar54._12_3_ = auVar43._12_3_;
      auVar65[10] = dims[1]._1_1_;
      auVar65._0_10_ = dims._0_10_;
      auVar65._11_4_ = auVar54._11_4_;
      auVar76[9] = 0;
      auVar76._0_9_ = dims._0_9_;
      auVar76._10_5_ = auVar65._10_5_;
      auVar87[8] = (char)dims[1];
      auVar87._0_8_ = dims._0_8_;
      auVar87._9_6_ = auVar76._9_6_;
      auVar109._7_8_ = 0;
      auVar109._0_7_ = auVar87._8_7_;
      auVar130._1_8_ = SUB158(auVar109 << 0x40,7);
      auVar130[0] = dims[0]._3_1_;
      auVar130._9_6_ = 0;
      auVar131._1_10_ = SUB1510(auVar130 << 0x30,5);
      auVar131[0] = dims[0]._2_1_;
      auVar131._11_4_ = 0;
      auVar98[2] = dims[0]._1_1_;
      auVar98._0_2_ = (ushort)dims[0];
      auVar98._3_12_ = SUB1512(auVar131 << 0x20,3);
      auVar164._0_2_ = (ushort)dims[0] & 0xff;
      auVar164._2_13_ = auVar98._2_13_;
      auVar164[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar164,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x20:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar172[1] = 0;
      auVar172[0] = (byte)dims[2];
      auVar172[2] = dims[2]._1_1_;
      auVar172[3] = 0;
      auVar172[4] = dims[2]._2_1_;
      auVar172[5] = 0;
      auVar172[6] = dims[2]._3_1_;
      auVar172[7] = 0;
      auVar172[8] = (char)dims[3];
      auVar172[9] = 0;
      auVar172[10] = dims[3]._1_1_;
      auVar172[0xb] = 0;
      auVar172[0xc] = dims[3]._2_1_;
      auVar172[0xd] = 0;
      auVar172[0xe] = dims[3]._3_1_;
      auVar172[0xf] = 0;
      auVar173 = pshuflw(auVar172,auVar172,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar29[0xd] = 0;
      auVar29._0_13_ = dims._0_13_;
      auVar29[0xe] = dims[1]._3_1_;
      auVar40[0xc] = dims[1]._2_1_;
      auVar40._0_12_ = dims._0_12_;
      auVar40._13_2_ = auVar29._13_2_;
      auVar51[0xb] = 0;
      auVar51._0_11_ = dims._0_11_;
      auVar51._12_3_ = auVar40._12_3_;
      auVar62[10] = dims[1]._1_1_;
      auVar62._0_10_ = dims._0_10_;
      auVar62._11_4_ = auVar51._11_4_;
      auVar73[9] = 0;
      auVar73._0_9_ = dims._0_9_;
      auVar73._10_5_ = auVar62._10_5_;
      auVar84[8] = (char)dims[1];
      auVar84._0_8_ = dims._0_8_;
      auVar84._9_6_ = auVar73._9_6_;
      auVar106._7_8_ = 0;
      auVar106._0_7_ = auVar84._8_7_;
      auVar124._1_8_ = SUB158(auVar106 << 0x40,7);
      auVar124[0] = dims[0]._3_1_;
      auVar124._9_6_ = 0;
      auVar125._1_10_ = SUB1510(auVar124 << 0x30,5);
      auVar125[0] = dims[0]._2_1_;
      auVar125._11_4_ = 0;
      auVar95[2] = dims[0]._1_1_;
      auVar95._0_2_ = (ushort)dims[0];
      auVar95._3_12_ = SUB1512(auVar125 << 0x20,3);
      auVar162._0_2_ = (ushort)dims[0] & 0xff;
      auVar162._2_13_ = auVar95._2_13_;
      auVar162[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar162,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = *(uchar *)(pfVar137 + lVar146);
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x21:
    sVar144 = 4;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(dims + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,4);
    }
    if (0xff < uVar133) {
      auVar174[1] = 0;
      auVar174[0] = (byte)dims[2];
      auVar174[2] = dims[2]._1_1_;
      auVar174[3] = 0;
      auVar174[4] = dims[2]._2_1_;
      auVar174[5] = 0;
      auVar174[6] = dims[2]._3_1_;
      auVar174[7] = 0;
      auVar174[8] = (char)dims[3];
      auVar174[9] = 0;
      auVar174[10] = dims[3]._1_1_;
      auVar174[0xb] = 0;
      auVar174[0xc] = dims[3]._2_1_;
      auVar174[0xd] = 0;
      auVar174[0xe] = dims[3]._3_1_;
      auVar174[0xf] = 0;
      auVar173 = pshuflw(auVar174,auVar174,0x1b);
      auVar174 = pshufhw(auVar173,auVar173,0x1b);
      auVar30[0xd] = 0;
      auVar30._0_13_ = dims._0_13_;
      auVar30[0xe] = dims[1]._3_1_;
      auVar41[0xc] = dims[1]._2_1_;
      auVar41._0_12_ = dims._0_12_;
      auVar41._13_2_ = auVar30._13_2_;
      auVar52[0xb] = 0;
      auVar52._0_11_ = dims._0_11_;
      auVar52._12_3_ = auVar41._12_3_;
      auVar63[10] = dims[1]._1_1_;
      auVar63._0_10_ = dims._0_10_;
      auVar63._11_4_ = auVar52._11_4_;
      auVar74[9] = 0;
      auVar74._0_9_ = dims._0_9_;
      auVar74._10_5_ = auVar63._10_5_;
      auVar85[8] = (char)dims[1];
      auVar85._0_8_ = dims._0_8_;
      auVar85._9_6_ = auVar74._9_6_;
      auVar107._7_8_ = 0;
      auVar107._0_7_ = auVar85._8_7_;
      auVar126._1_8_ = SUB158(auVar107 << 0x40,7);
      auVar126[0] = dims[0]._3_1_;
      auVar126._9_6_ = 0;
      auVar127._1_10_ = SUB1510(auVar126 << 0x30,5);
      auVar127[0] = dims[0]._2_1_;
      auVar127._11_4_ = 0;
      auVar96[2] = dims[0]._1_1_;
      auVar96._0_2_ = (ushort)dims[0];
      auVar96._3_12_ = SUB1512(auVar127 << 0x20,3);
      auVar173._0_2_ = (ushort)dims[0] & 0xff;
      auVar173._2_13_ = auVar96._2_13_;
      auVar173[0xf] = 0;
      auVar173 = pshuflw((undefined1  [16])0x0,auVar173,0x1b);
      auVar173 = pshufhw(auVar173,auVar173,0x1b);
      sVar6 = auVar173._0_2_;
      sVar7 = auVar173._2_2_;
      sVar8 = auVar173._4_2_;
      sVar9 = auVar173._6_2_;
      sVar10 = auVar173._8_2_;
      sVar11 = auVar173._10_2_;
      sVar12 = auVar173._12_2_;
      sVar13 = auVar173._14_2_;
      sVar14 = auVar174._0_2_;
      sVar15 = auVar174._2_2_;
      sVar16 = auVar174._4_2_;
      sVar17 = auVar174._6_2_;
      sVar18 = auVar174._8_2_;
      sVar19 = auVar174._10_2_;
      sVar20 = auVar174._12_2_;
      sVar21 = auVar174._14_2_;
      dims[0]._1_1_ = (0 < sVar7) * (sVar7 < 0x100) * auVar173[2] - (0xff < sVar7);
      dims[0]._0_1_ = (0 < sVar6) * (sVar6 < 0x100) * auVar173[0] - (0xff < sVar6);
      dims[0]._2_1_ = (0 < sVar8) * (sVar8 < 0x100) * auVar173[4] - (0xff < sVar8);
      dims[0]._3_1_ = (0 < sVar9) * (sVar9 < 0x100) * auVar173[6] - (0xff < sVar9);
      dims[1]._0_1_ = (0 < sVar10) * (sVar10 < 0x100) * auVar173[8] - (0xff < sVar10);
      dims[1]._1_1_ = (0 < sVar11) * (sVar11 < 0x100) * auVar173[10] - (0xff < sVar11);
      dims[1]._2_1_ = (0 < sVar12) * (sVar12 < 0x100) * auVar173[0xc] - (0xff < sVar12);
      dims[1]._3_1_ = (0 < sVar13) * (sVar13 < 0x100) * auVar173[0xe] - (0xff < sVar13);
      dims[2]._0_1_ = (0 < sVar14) * (sVar14 < 0x100) * auVar174[0] - (0xff < sVar14);
      dims[2]._1_1_ = (0 < sVar15) * (sVar15 < 0x100) * auVar174[2] - (0xff < sVar15);
      dims[2]._2_1_ = (0 < sVar16) * (sVar16 < 0x100) * auVar174[4] - (0xff < sVar16);
      dims[2]._3_1_ = (0 < sVar17) * (sVar17 < 0x100) * auVar174[6] - (0xff < sVar17);
      dims[3]._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * auVar174[8] - (0xff < sVar18);
      dims[3]._1_1_ = (0 < sVar19) * (sVar19 < 0x100) * auVar174[10] - (0xff < sVar19);
      dims[3]._2_1_ = (0 < sVar20) * (sVar20 < 0x100) * auVar174[0xc] - (0xff < sVar20);
      dims[3]._3_1_ = (0 < sVar21) * (sVar21 < 0x100) * auVar174[0xe] - (0xff < sVar21);
    }
    assign(this,dims[3],dims[2],dims[1],dims[0]);
    uVar152 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    uVar143 = uVar152 * 4;
    pfVar137 = (float *)operator_new__(-(ulong)(uVar152 >> 0x3e != 0) | uVar143);
    if (uVar152 != 0) {
      lVar154 = 0;
      uVar145 = uVar152;
      do {
        sVar144 = 0xfc0000;
        if (uVar145 * 4 < 0x3f00000) {
          sVar144 = uVar145;
        }
        sVar134 = fread(pfVar137 + lVar154,4,sVar144,(FILE *)file);
        lVar154 = lVar154 + sVar134;
        uVar145 = uVar145 - sVar134;
      } while ((sVar144 == sVar134) && (uVar145 != 0));
      if (uVar145 != 0) {
        cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,uVar152);
      }
      if ((0xff < uVar133) && (0 < (long)uVar152)) {
        pfVar138 = pfVar137 + uVar152;
        do {
          fVar4 = pfVar138[-1];
          pfVar138[-1] = (float)((uint)fVar4 >> 0x18 | ((uint)fVar4 & 0xff0000) >> 8 |
                                 ((uint)fVar4 & 0xff00) << 8 | (int)fVar4 << 0x18);
          pfVar138 = pfVar138 + -1;
        } while (pfVar137 < pfVar138);
      }
    }
    lVar154 = (ulong)this->_spectrum * (ulong)this->_depth *
              (ulong)this->_height * (ulong)this->_width;
    if (lVar154 != 0) {
      puVar5 = this->_data;
      lVar141 = 0;
      lVar146 = 0;
      do {
        puVar5[lVar146] = (uchar)(int)pfVar137[lVar146];
        lVar146 = lVar146 + 1;
        lVar141 = lVar141 + -4;
      } while (lVar154 - lVar146 != 0);
      goto LAB_001b0b05;
    }
    break;
  case 0x22:
    sVar144 = 1;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(ptbuf + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,1);
    }
    if (0xff < uVar133) {
      ptbuf[0] = (uint)ptbuf[0] >> 0x18 | (ptbuf[0] & 0xff0000U) >> 8 | (ptbuf[0] & 0xff00U) << 8 |
                 ptbuf[0] << 0x18;
    }
    assign(this,1,1,1,1);
    *this->_data = (uchar)ptbuf[0];
    goto LAB_001b0b13;
  case 0x23:
    sVar144 = 2;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(ptbuf + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,2);
    }
    if (0xff < uVar133) {
      piVar142 = ptbuf + 2;
      do {
        uVar133 = piVar142[-1];
        piVar142[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        piVar142 = piVar142 + -1;
      } while (ptbuf < piVar142);
    }
    assign(this,2,1,1,1);
    *this->_data = (uchar)ptbuf[1];
    this->_data[1] = (uchar)ptbuf[0];
    goto LAB_001b0b13;
  case 0x24:
    sVar144 = 3;
    lVar154 = 0;
    do {
      sVar134 = 0xfc0000;
      if (sVar144 * 4 < 0x3f00000) {
        sVar134 = sVar144;
      }
      sVar135 = fread(ptbuf + lVar154,4,sVar134,(FILE *)file);
      lVar154 = lVar154 + sVar135;
      sVar144 = sVar144 - sVar135;
    } while ((sVar134 == sVar135) && (sVar144 != 0));
    if (sVar144 != 0) {
      cimg::warn("cimg::fread(): Only %lu/%lu elements could be read from file.",lVar154,3);
    }
    if (0xff < uVar133) {
      piVar142 = ptbuf + 3;
      do {
        uVar133 = piVar142[-1];
        piVar142[-1] = uVar133 >> 0x18 | (uVar133 & 0xff0000) >> 8 | (uVar133 & 0xff00) << 8 |
                       uVar133 << 0x18;
        piVar142 = piVar142 + -1;
      } while (ptbuf < piVar142);
    }
    assign(this,3,1,1,1);
    *this->_data = (uchar)ptbuf[2];
    this->_data[1] = (uchar)ptbuf[1];
    this->_data[2] = (uchar)ptbuf[0];
    goto LAB_001b0b13;
  }
  pvVar153 = (void *)((long)pfVar137 - uVar143);
LAB_001b0b0e:
  operator_delete__(pvVar153);
LAB_001b0b13:
  if ((((local_58 == (FILE *)0x0) && (_stdin != (FILE *)file)) && (_stdout != (FILE *)file)) &&
     (uVar133 = fclose((FILE *)file), uVar133 != 0)) {
    cimg::warn("cimg::fclose(): Error code %d returned during file closing.",(ulong)uVar133);
  }
  if ((header._is_shared == false) && (header._data != (char *)0x0)) {
    operator_delete__(header._data);
  }
  return this;
}

Assistant:

CImg<T>& _load_pandore(std::FILE *const file, const char *const filename) {
#define __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,ndim,stype) \
        cimg::fread(dims,nbdim,nfile); \
        if (endian) cimg::invert_endianness(dims,nbdim); \
        assign(nwidth,nheight,ndepth,ndim); \
        const size_t siz = size(); \
        stype *buffer = new stype[siz]; \
        cimg::fread(buffer,siz,nfile); \
        if (endian) cimg::invert_endianness(buffer,siz); \
        T *ptrd = _data; \
        cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++); \
        buffer-=siz; \
        delete[] buffer

#define _cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1,stype2,stype3,ltype) { \
        if (sizeof(stype1)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype1); } \
        else if (sizeof(stype2)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype2); } \
        else if (sizeof(stype3)==ltype) { __cimg_load_pandore_case(nbdim,nwidth,nheight,ndepth,dim,stype3); } \
        else throw CImgIOException(_cimg_instance \
                                   "load_pandore(): Unknown pixel datatype in file '%s'.", \
                                   cimg_instance, \
                                   filename?filename:"(FILE*)"); }
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_pandore(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<charT> header(32);
      cimg::fread(header._data,12,nfile);
      if (cimg::strncasecmp("PANDORE",header,7)) {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): PANDORE header not found in file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }
      unsigned int imageid, dims[8] = { 0 };
      int ptbuf[4] = { 0 };
      cimg::fread(&imageid,1,nfile);
      const bool endian = imageid>255;
      if (endian) cimg::invert_endianness(imageid);
      cimg::fread(header._data,20,nfile);

      switch (imageid) {
      case 2 : _cimg_load_pandore_case(2,dims[1],1,1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 3 : _cimg_load_pandore_case(2,dims[1],1,1,1,long,int,short,4); break;
      case 4 : _cimg_load_pandore_case(2,dims[1],1,1,1,double,float,float,4); break;
      case 5 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,unsigned char,unsigned char,unsigned char,1); break;
      case 6 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,long,int,short,4); break;
      case 7 : _cimg_load_pandore_case(3,dims[2],dims[1],1,1,double,float,float,4); break;
      case 8 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,unsigned char,unsigned char,unsigned char,1); break;
      case 9 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,long,int,short,4); break;
      case 10 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],1,double,float,float,4); break;
      case 11 : { // Region 1D
        cimg::fread(dims,3,nfile);
        if (endian) cimg::invert_endianness(dims,3);
        assign(dims[1],1,1,1);
        const unsigned siz = size();
        if (dims[2]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[2]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 12 : { // Region 2D
        cimg::fread(dims,4,nfile);
        if (endian) cimg::invert_endianness(dims,4);
        assign(dims[2],dims[1],1,1);
        const size_t siz = size();
        if (dims[3]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[3]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 13 : { // Region 3D
        cimg::fread(dims,5,nfile);
        if (endian) cimg::invert_endianness(dims,5);
        assign(dims[3],dims[2],dims[1],1);
        const size_t siz = size();
        if (dims[4]<256) {
          unsigned char *buffer = new unsigned char[siz];
          cimg::fread(buffer,siz,nfile);
          T *ptrd = _data;
          cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
          buffer-=siz;
          delete[] buffer;
        } else {
          if (dims[4]<65536) {
            unsigned short *buffer = new unsigned short[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          } else {
            unsigned int *buffer = new unsigned int[siz];
            cimg::fread(buffer,siz,nfile);
            if (endian) cimg::invert_endianness(buffer,siz);
            T *ptrd = _data;
            cimg_foroff(*this,off) *(ptrd++) = (T)*(buffer++);
            buffer-=siz;
            delete[] buffer;
          }
        }
      }
        break;
      case 16 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,unsigned char,unsigned char,unsigned char,1); break;
      case 17 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,long,int,short,4); break;
      case 18 : _cimg_load_pandore_case(4,dims[2],dims[1],1,3,double,float,float,4); break;
      case 19 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,unsigned char,unsigned char,unsigned char,1); break;
      case 20 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,long,int,short,4); break;
      case 21 : _cimg_load_pandore_case(5,dims[3],dims[2],dims[1],3,double,float,float,4); break;
      case 22 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 23 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],long,int,short,4); break;
      case 24 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 25 : _cimg_load_pandore_case(2,dims[1],1,1,dims[0],double,float,float,4); break;
      case 26 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned char,unsigned char,unsigned char,1); break;
      case 27 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],long,int,short,4); break;
      case 28 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],unsigned long,unsigned int,unsigned short,4); break;
      case 29 : _cimg_load_pandore_case(3,dims[2],dims[1],1,dims[0],double,float,float,4); break;
      case 30 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned char,unsigned char,unsigned char,1);
        break;
      case 31 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],long,int,short,4); break;
      case 32 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],unsigned long,unsigned int,unsigned short,4);
        break;
      case 33 : _cimg_load_pandore_case(4,dims[3],dims[2],dims[1],dims[0],double,float,float,4); break;
      case 34 : { // Points 1D
        cimg::fread(ptbuf,1,nfile);
        if (endian) cimg::invert_endianness(ptbuf,1);
        assign(1); (*this)(0) = (T)ptbuf[0];
      } break;
      case 35 : { // Points 2D
        cimg::fread(ptbuf,2,nfile);
        if (endian) cimg::invert_endianness(ptbuf,2);
        assign(2); (*this)(0) = (T)ptbuf[1]; (*this)(1) = (T)ptbuf[0];
      } break;
      case 36 : { // Points 3D
        cimg::fread(ptbuf,3,nfile);
        if (endian) cimg::invert_endianness(ptbuf,3);
        assign(3); (*this)(0) = (T)ptbuf[2]; (*this)(1) = (T)ptbuf[1]; (*this)(2) = (T)ptbuf[0];
      } break;
      default :
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_pandore(): Unable to load data with ID_type %u in file '%s'.",
                              cimg_instance,
                              imageid,filename?filename:"(FILE*)");
      }
      if (!file) cimg::fclose(nfile);
      return *this;
    }